

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.c
# Opt level: O2

void propose_letter(char *word,char *attempted_letters,char attempt,uint8_t *n_errs)

{
  undefined8 in_RAX;
  char *pcVar1;
  undefined3 in_register_00000011;
  char attempt_str [2];
  undefined8 uStack_28;
  
  if (0xe5 < (byte)(attempt + 0xa5U)) {
    uStack_28 = in_RAX;
    pcVar1 = strchr(attempted_letters,CONCAT31(in_register_00000011,attempt));
    if (pcVar1 == (char *)0x0) {
      uStack_28 = (ulong)CONCAT16(attempt,(undefined6)uStack_28);
      strcat(attempted_letters,(char *)((long)&uStack_28 + 6));
      pcVar1 = strchr(word,CONCAT31(in_register_00000011,attempt));
      if (pcVar1 == (char *)0x0) {
        *n_errs = *n_errs + '\x01';
      }
    }
  }
  return;
}

Assistant:

void propose_letter(const char* word, char attempted_letters[27], char attempt, uint8_t* n_errs) {
  if (attempt < 'A' || attempt > 'Z') return;
  if (strchr(attempted_letters, attempt) != NULL) return;
  char attempt_str[2] = {attempt, 0};
  strcat(attempted_letters, attempt_str);
  if (strchr(word, attempt) == NULL) {
    *n_errs += 1;
  }
}